

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

TargetOrString * __thiscall
cmGeneratorTarget::ResolveTargetReference
          (TargetOrString *__return_storage_ptr__,cmGeneratorTarget *this,string *name,
          cmLocalGenerator *lg)

{
  cmGeneratorTarget *pcVar1;
  
  (__return_storage_ptr__->String)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->String).field_2;
  (__return_storage_ptr__->String)._M_string_length = 0;
  (__return_storage_ptr__->String).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Target = (cmGeneratorTarget *)0x0;
  pcVar1 = cmLocalGenerator::FindGeneratorTargetToUse(lg,name);
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    __return_storage_ptr__->Target = pcVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::TargetOrString cmGeneratorTarget::ResolveTargetReference(
  std::string const& name, cmLocalGenerator const* lg) const
{
  TargetOrString resolved;

  if (cmGeneratorTarget* tgt = lg->FindGeneratorTargetToUse(name)) {
    resolved.Target = tgt;
  } else {
    resolved.String = name;
  }

  return resolved;
}